

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

int Hop_ManCountLevels(Hop_Man_t *p)

{
  int iVar1;
  undefined8 *puVar2;
  Vec_Ptr_t *p_00;
  long *plVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  
  (p->pConst1->field_0).pData = (void *)0x0;
  for (iVar5 = 0; iVar5 < p->vPis->nSize; iVar5 = iVar5 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(p->vPis,iVar5);
    *puVar2 = 0;
  }
  p_00 = Hop_ManDfs(p);
  for (iVar5 = 0; iVar5 < p_00->nSize; iVar5 = iVar5 + 1) {
    plVar3 = (long *)Vec_PtrEntry(p_00,iVar5);
    iVar6 = *(int *)(plVar3[3] & 0xfffffffffffffffe);
    if (*(int *)(plVar3[3] & 0xfffffffffffffffe) < *(int *)(plVar3[2] & 0xfffffffffffffffe)) {
      iVar6 = *(int *)(plVar3[2] & 0xfffffffffffffffe);
    }
    *plVar3 = (long)(int)((uint)((*(uint *)(plVar3 + 4) & 7) == 5) + iVar6 + 1);
  }
  free(p_00->pArray);
  free(p_00);
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < p->vPos->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p->vPos,iVar6);
    iVar1 = *(int *)(*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe);
    if (iVar5 <= iVar1) {
      iVar5 = iVar1;
    }
  }
  return iVar5;
}

Assistant:

int Hop_ManCountLevels( Hop_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i, LevelsMax, Level0, Level1;
    // initialize the levels
    Hop_ManConst1(p)->pData = NULL;
    Hop_ManForEachPi( p, pObj, i )
        pObj->pData = NULL;
    // compute levels in a DFS order
    vNodes = Hop_ManDfs( p );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
    {
        Level0 = (int)(ABC_PTRUINT_T)Hop_ObjFanin0(pObj)->pData;
        Level1 = (int)(ABC_PTRUINT_T)Hop_ObjFanin1(pObj)->pData;
        pObj->pData = (void *)(ABC_PTRUINT_T)(1 + Hop_ObjIsExor(pObj) + Abc_MaxInt(Level0, Level1));
    }
    Vec_PtrFree( vNodes );
    // get levels of the POs
    LevelsMax = 0;
    Hop_ManForEachPo( p, pObj, i )
        LevelsMax = Abc_MaxInt( LevelsMax, (int)(ABC_PTRUINT_T)Hop_ObjFanin0(pObj)->pData );
    return LevelsMax;
}